

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

void monster_group_split(chunk *c,monster_group_conflict *group,monster *leader)

{
  monster_group_conflict *group_00;
  void *p;
  monster *mon_00;
  monster_group_conflict *new_group;
  monster *mon;
  wchar_t i;
  wchar_t current;
  int *temp;
  mon_group_list_entry_conflict *entry;
  monster *leader_local;
  monster_group_conflict *group_local;
  chunk *c_local;
  
  p = mem_zalloc((ulong)z_info->level_monster_max << 2);
  mon._4_4_ = 0;
  temp = &group->member_list->midx;
  do {
    if (temp == (int *)0x0) {
      mem_free(p);
      return;
    }
    mon_00 = c->monsters + *temp;
    for (mon._0_4_ = 0; (int)mon < mon._4_4_; mon._0_4_ = (int)mon + 1) {
      group_00 = c->monster_groups[*(int *)((long)p + (long)(int)mon * 4)];
      if (c->monsters[group_00->member_list->midx].race == mon_00->race) {
        mon_00->group_info[0].index = *(wchar_t *)((long)p + (long)(int)mon * 4);
        mon_00->group_info[0].role = MON_GROUP_MEMBER;
        monster_add_to_group(c,mon_00,group_00);
        break;
      }
    }
    if (mon_00->group_info[0].index == group->index) {
      monster_group_start(c,mon_00,L'\0');
      *(wchar_t *)((long)p + (long)mon._4_4_ * 4) = mon_00->group_info[0].index;
      mon._4_4_ = mon._4_4_ + 1;
    }
    temp = *(int **)(temp + 2);
  } while( true );
}

Assistant:

static void monster_group_split(struct chunk *c, struct monster_group *group,
								struct monster *leader)
{
	struct mon_group_list_entry *entry;

	/* Keep a list of groups made for easy checking */
	int *temp = mem_zalloc(z_info->level_monster_max * sizeof(int));
	int current = 0;

	/* Go through the monsters in the group */
	for (entry = group->member_list; entry; entry = entry->next) {
		int i;
		struct monster *mon = &c->monsters[entry->midx];

		/* Check all groups to see if they contain a monster of this race */
		for (i = 0; i < current; i++) {
			struct monster_group *new_group = c->monster_groups[temp[i]];

			/* If it's the right group, add the monster and stop checking */
			if (c->monsters[new_group->member_list->midx].race == mon->race) {
				mon->group_info[PRIMARY_GROUP].index = temp[i];
				mon->group_info[PRIMARY_GROUP].role = MON_GROUP_MEMBER;
				monster_add_to_group(c, mon, new_group);
				break;
			}
		}

		/* If the monster's still in the old group, make a new one */
		if (mon->group_info[PRIMARY_GROUP].index == group->index) {
			monster_group_start(c, mon, 0);

			/* Store the new index */
			temp[current++] = mon->group_info[PRIMARY_GROUP].index;
		}
	}
	mem_free(temp);
}